

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

string * __thiscall Image::toString_abi_cxx11_(string *__return_storage_ptr__,Image *this)

{
  ostream *poVar1;
  int x;
  uint uVar2;
  char *pcVar3;
  int y;
  uint uVar4;
  int c;
  ulong uVar5;
  stringstream ss;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 auStack_198 [45];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  for (uVar4 = 0; uVar4 < this->height; uVar4 = uVar4 + 1) {
    for (uVar2 = 0; uVar2 < this->width; uVar2 = uVar2 + 1) {
      for (uVar5 = 0; uVar5 < this->colors; uVar5 = uVar5 + 1) {
        *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 3;
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        pcVar3 = ",";
        if (uVar5 == this->colors - 1) {
          pcVar3 = "|";
        }
        std::operator<<(poVar1,pcVar3);
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string Image::toString() {
  std::stringstream ss;
  for (int y = 0; y < height; y++) {
    for (int x = 0; x < width; x++) {
      for (int c = 0; c < colors; c++) {
        ss << std::setw(3) << (unsigned int) pixels[(y * width + x)].colors[c]
           << (c == colors - 1 ? "|" : ",");
      }
    }
    ss << std::endl;
  }
  return ss.str();
}